

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

void arrow_array_stream_wrapper::anon_unknown_0::FactoryGetSchema
               (ArrowArrayStream *stream,ArrowSchema *schema)

{
  (*stream->get_schema)(stream,schema);
  schema->release = (_func_void_ArrowSchema_ptr *)0x0;
  return;
}

Assistant:

void FactoryGetSchema(ArrowArrayStream *stream, ArrowSchema &schema) {
	stream->get_schema(stream, &schema);

	// Need to nullify the root schema's release function here, because streams don't allow us to set the release
	// function. For the schema's children, we nullify the release functions in `duckdb_arrow_scan`, so we don't need to
	// handle them again here. We set this to nullptr and not EmptySchemaRelease to prevent ArrowSchemaWrapper's
	// destructor from destroying the schema (it's the caller's responsibility).
	schema.release = nullptr;
}